

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLockLock::ArchiveOUT(ChLinkLockLock *this,ChArchiveOut *marchive)

{
  AngleSet_mapper setmapper;
  AngleSet_mapper local_80;
  ChEnumMapper<chrono::AngleSet> local_60;
  char *local_40;
  ChEnumMapper<chrono::AngleSet> *local_38;
  undefined1 local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkLockLock>(marchive);
  ChLinkMarkers::ArchiveOUT((ChLinkMarkers *)this,marchive);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr =
       (AngleSet *)&(this->super_ChLinkLock).d_restlength;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x9643e5;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_X;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x954785;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_Y;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x95478e;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_Z;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x954797;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_ang;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x9547a0;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_ang2;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x96441b;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_ang3;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x964427;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_80);
  local_80.super_ChEnumMapper<chrono::AngleSet>.value_ptr = (AngleSet *)&this->motion_axis;
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)0x9547ab;
  local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>
            (marchive,(ChNameValue<chrono::ChVector<double>_> *)&local_80);
  my_enum_mappers_angles::AngleSet_mapper::AngleSet_mapper(&local_80);
  my_enum_mappers_angles::AngleSet_mapper::operator()(&local_60,&local_80,&this->angleset);
  local_40 = "angle_set";
  local_30 = 0;
  local_38 = &local_60;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b16cb0
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<chrono::AngleSet>.super_ChEnumMapperBase._vptr_ChEnumMapperBase =
       (_func_int **)&PTR_GetValueAsInt_00b16cb0;
  if (local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::AngleSet>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::AngleSet>,_std::allocator<chrono::ChEnumNamePair<chrono::AngleSet>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChLinkLockLock::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkLockLock>();

    // serialize parent class
    ChLinkMarkers::ArchiveOUT(marchive);

    // serialize all member data
    ////marchive << CHNVP(mask); //// TODO: needed?

    marchive << CHNVP(d_restlength);

    ////marchive << CHNVP(force_D);
    ////marchive << CHNVP(force_R);
    ////marchive << CHNVP(force_X);
    ////marchive << CHNVP(force_Y);
    ////marchive << CHNVP(force_Z);
    ////marchive << CHNVP(force_Rx);
    ////marchive << CHNVP(force_Ry);
    ////marchive << CHNVP(force_Rz);

    ////marchive << CHNVP(limit_X);
    ////marchive << CHNVP(limit_Y);
    ////marchive << CHNVP(limit_Z);
    ////marchive << CHNVP(limit_Rx);
    ////marchive << CHNVP(limit_Ry);
    ////marchive << CHNVP(limit_Rz);
    ////marchive << CHNVP(limit_Rp);
    ////marchive << CHNVP(limit_D);

    marchive << CHNVP(motion_X);
    marchive << CHNVP(motion_Y);
    marchive << CHNVP(motion_Z);
    marchive << CHNVP(motion_ang);
    marchive << CHNVP(motion_ang2);
    marchive << CHNVP(motion_ang3);
    marchive << CHNVP(motion_axis);

    my_enum_mappers_angles::AngleSet_mapper setmapper;
    marchive << CHNVP(setmapper(angleset), "angle_set");
}